

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_set_from_axis_anglev3(quaternion *self,vector3 *axis,double angle)

{
  quaternion *pqVar1;
  double angle_local;
  vector3 *axis_local;
  quaternion *self_local;
  
  pqVar1 = quaternion_set_from_axis_anglef3
                     (self,(axis->field_0).v[0],(axis->field_0).v[1],(axis->field_0).v[2],angle);
  return pqVar1;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_axis_anglev3(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	return quaternion_set_from_axis_anglef3(self, axis->x, axis->y, axis->z, angle);
}